

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O2

void __thiscall Utest::run(Utest *this)

{
  int iVar1;
  UtestShell *pUVar2;
  
  pUVar2 = UtestShell::getCurrent();
  (*pUVar2->_vptr_UtestShell[0x1e])(pUVar2,"\n-------- before setup: ");
  iVar1 = (*PlatformSpecificSetJmp)(helperDoTestSetup,this);
  (*pUVar2->_vptr_UtestShell[0x1e])(pUVar2,"\n-------- after  setup: ");
  if (iVar1 != 0) {
    (*pUVar2->_vptr_UtestShell[0x1e])(pUVar2,"\n----------  before body: ");
    (*PlatformSpecificSetJmp)(helperDoTestBody,this);
    (*pUVar2->_vptr_UtestShell[0x1e])(pUVar2,"\n----------  after body: ");
  }
  (*pUVar2->_vptr_UtestShell[0x1e])(pUVar2,"\n--------  before teardown: ");
  (*PlatformSpecificSetJmp)(helperDoTestTeardown,this);
  (*pUVar2->_vptr_UtestShell[0x1e])(pUVar2,"\n--------  after teardown: ");
  return;
}

Assistant:

void Utest::run()
{
    UtestShell* current = UtestShell::getCurrent();
    int jumpResult = 0;
    try {
        current->printVeryVerbose("\n-------- before setup: ");
        jumpResult = PlatformSpecificSetJmp(helperDoTestSetup, this);
        current->printVeryVerbose("\n-------- after  setup: ");

        if (jumpResult) {
            current->printVeryVerbose("\n----------  before body: ");
            PlatformSpecificSetJmp(helperDoTestBody, this);
            current->printVeryVerbose("\n----------  after body: ");
        }
    }
    catch (CppUTestFailedException&)
    {
        PlatformSpecificRestoreJumpBuffer();
    }

    try {
        current->printVeryVerbose("\n--------  before teardown: ");
        PlatformSpecificSetJmp(helperDoTestTeardown, this);
        current->printVeryVerbose("\n--------  after teardown: ");
    }
    catch (CppUTestFailedException&)
    {
        PlatformSpecificRestoreJumpBuffer();
    }

}